

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_RsbFindMints(Gia_RsbMan_t *p,int *pMint0,int *pMint1)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  
  uVar2 = Abc_Random(0);
  iVar3 = Vec_IntEntry(p->vActive,uVar2 % (uint)p->vActive->nSize);
  p_00 = Vec_WecEntry(p->vSets[0],iVar3);
  p_01 = Vec_WecEntry(p->vSets[1],iVar3);
  uVar4 = Abc_Random(0);
  uVar2 = p_00->nSize;
  uVar5 = Abc_Random(0);
  uVar1 = p_01->nSize;
  iVar3 = Vec_IntEntry(p_00,uVar4 % uVar2);
  iVar6 = Vec_IntEntry(p_01,uVar5 % uVar1);
  *pMint0 = iVar3;
  *pMint1 = iVar6;
  return;
}

Assistant:

void Gia_RsbFindMints( Gia_RsbMan_t * p, int * pMint0, int * pMint1 )
{
    int iSetI = Abc_Random(0) % Vec_IntSize(p->vActive);
    int iSet  = Vec_IntEntry( p->vActive, iSetI );
    Vec_Int_t * vArray0 = Vec_WecEntry(p->vSets[0], iSet);
    Vec_Int_t * vArray1 = Vec_WecEntry(p->vSets[1], iSet);
    int iMint0i = Abc_Random(0) % Vec_IntSize(vArray0);
    int iMint1i = Abc_Random(0) % Vec_IntSize(vArray1);
    int iMint0 = Vec_IntEntry( vArray0, iMint0i );
    int iMint1 = Vec_IntEntry( vArray1, iMint1i );
    *pMint0 = iMint0;
    *pMint1 = iMint1;
}